

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O2

void __thiscall
bssl::anon_unknown_0::SpanDeathTest_BoundsChecks_Test::TestBody
          (SpanDeathTest_BoundsChecks_Test *this)

{
  ReturnSentinel RVar1;
  ReturnSentinel RVar2;
  int *piVar3;
  bool bVar4;
  char cVar5;
  int iVar6;
  char *pcVar7;
  DeathTest DVar8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var9;
  ReturnSentinel gtest_sentinel;
  Span<const_int> empty;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_128 [4];
  ReturnSentinel gtest_sentinel_4;
  Span<const_int> span;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_f0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_d8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_c0;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_a8;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_90;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_60;
  int v [4];
  
  v[0] = 1;
  v[1] = 2;
  v[2] = 3;
  v[3] = 4;
  span.size_ = 3;
  span.data_ = v;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)empty.size_);
    bVar4 = testing::internal::DeathTest::Create
                      ("span[3]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_60,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6b,(DeathTest **)&empty);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_60);
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)empty.data_;
    if (!bVar4) goto LAB_0014b953;
    if (empty.data_ != (int *)0x0) {
      iVar6 = (**(code **)(*(long *)empty.data_ + 0x10))(empty.data_);
      piVar3 = empty.data_;
      if (iVar6 == 0) {
        iVar6 = (**(code **)(*(long *)empty.data_ + 0x18))(empty.data_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*(long *)piVar3 + 0x20))(piVar3,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
          goto LAB_0014b953;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel.test_ = (DeathTest *)empty.data_;
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4 && span.size_ < 4) goto LAB_0014c117;
        (**(code **)(*(long *)empty.data_ + 0x28))(empty.data_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar8._vptr_DeathTest = *(_func_int ***)_Var9._M_head_impl;
      goto LAB_0014b9a2;
    }
  }
  else {
LAB_0014b953:
    testing::Message::Message((Message *)local_128);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6b,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&empty,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&empty);
    if (local_128[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar8._vptr_DeathTest = *(_func_int ***)local_128[0]._M_head_impl;
      _Var9._M_head_impl = local_128[0]._M_head_impl;
LAB_0014b9a2:
      (*DVar8._vptr_DeathTest[1])(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)empty.size_);
    bVar4 = testing::internal::DeathTest::Create
                      ("span.subspan(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6c,(DeathTest **)&empty);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)empty.data_;
    if (!bVar4) goto LAB_0014ba91;
    if (empty.data_ != (int *)0x0) {
      iVar6 = (**(code **)(*(long *)empty.data_ + 0x10))(empty.data_);
      piVar3 = empty.data_;
      if (iVar6 == 0) {
        iVar6 = (**(code **)(*(long *)empty.data_ + 0x18))(empty.data_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*(long *)piVar3 + 0x20))(piVar3,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
          goto LAB_0014ba91;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel.test_ = (DeathTest *)empty.data_;
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          Span<const_int>::subspan(&span,4,0xffffffffffffffff);
        }
        (**(code **)(*(long *)empty.data_ + 0x28))(empty.data_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar8._vptr_DeathTest = *(_func_int ***)_Var9._M_head_impl;
      goto LAB_0014bae0;
    }
  }
  else {
LAB_0014ba91:
    testing::Message::Message((Message *)local_128);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6c,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&empty,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&empty);
    if (local_128[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar8._vptr_DeathTest = *(_func_int ***)local_128[0]._M_head_impl;
      _Var9._M_head_impl = local_128[0]._M_head_impl;
LAB_0014bae0:
      (*DVar8._vptr_DeathTest[1])(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)empty.size_);
    bVar4 = testing::internal::DeathTest::Create
                      ("span.first(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_90,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6d,(DeathTest **)&empty);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_90);
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)empty.data_;
    if (!bVar4) goto LAB_0014bbcc;
    if (empty.data_ != (int *)0x0) {
      iVar6 = (**(code **)(*(long *)empty.data_ + 0x10))(empty.data_);
      piVar3 = empty.data_;
      if (iVar6 == 0) {
        iVar6 = (**(code **)(*(long *)empty.data_ + 0x18))(empty.data_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*(long *)piVar3 + 0x20))(piVar3,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
          goto LAB_0014bbcc;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel.test_ = (DeathTest *)empty.data_;
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          Span<const_int>::first(&span,4);
        }
        (**(code **)(*(long *)empty.data_ + 0x28))(empty.data_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar8._vptr_DeathTest = *(_func_int ***)_Var9._M_head_impl;
      goto LAB_0014bc1b;
    }
  }
  else {
LAB_0014bbcc:
    testing::Message::Message((Message *)local_128);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6d,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&empty,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&empty);
    if (local_128[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar8._vptr_DeathTest = *(_func_int ***)local_128[0]._M_head_impl;
      _Var9._M_head_impl = local_128[0]._M_head_impl;
LAB_0014bc1b:
      (*DVar8._vptr_DeathTest[1])(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)empty.size_);
    bVar4 = testing::internal::DeathTest::Create
                      ("span.last(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_a8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6e,(DeathTest **)&empty);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_a8);
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)empty.data_;
    if (!bVar4) goto LAB_0014bd07;
    if (empty.data_ != (int *)0x0) {
      iVar6 = (**(code **)(*(long *)empty.data_ + 0x10))(empty.data_);
      if (iVar6 == 0) {
        iVar6 = (**(code **)(*(long *)empty.data_ + 0x18))(empty.data_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        cVar5 = (**(code **)(*(long *)empty.data_ + 0x20))(empty.data_,bVar4);
        if (cVar5 == '\0') {
          (**(code **)(*(long *)_Var9._M_head_impl + 8))(_Var9._M_head_impl);
          goto LAB_0014bd07;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel.test_ = (DeathTest *)empty.data_;
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          Span<const_int>::last(&span,4);
        }
        (**(code **)(*(long *)empty.data_ + 0x28))(empty.data_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel);
      }
      DVar8._vptr_DeathTest = *(_func_int ***)_Var9._M_head_impl;
      goto LAB_0014bd56;
    }
  }
  else {
LAB_0014bd07:
    testing::Message::Message((Message *)local_128);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6e,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&empty,(Message *)local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&empty);
    if (local_128[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar8._vptr_DeathTest = *(_func_int ***)local_128[0]._M_head_impl;
      _Var9._M_head_impl = local_128[0]._M_head_impl;
LAB_0014bd56:
      (*DVar8._vptr_DeathTest[1])(_Var9._M_head_impl);
    }
  }
  empty.size_ = 0;
  empty.data_ = v;
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)empty.size_);
    bVar4 = testing::internal::DeathTest::Create
                      ("empty[0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_c0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x71,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_c0);
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar4) goto LAB_0014be4f;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar6 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar1 = gtest_sentinel;
      if (iVar6 == 0) {
        iVar6 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        iVar6 = (*(RVar1.test_)->_vptr_DeathTest[4])(RVar1.test_,(ulong)bVar4);
        if ((char)iVar6 == '\0') {
          (*((DeathTest *)_Var9._M_head_impl)->_vptr_DeathTest[1])(_Var9._M_head_impl);
          goto LAB_0014be4f;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel_4 = gtest_sentinel;
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4 && empty.size_ == 0) {
LAB_0014c117:
          abort();
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel_4);
      }
      DVar8 = (DeathTest)((DeathTest *)_Var9._M_head_impl)->_vptr_DeathTest;
      goto LAB_0014be9e;
    }
  }
  else {
LAB_0014be4f:
    testing::Message::Message((Message *)local_128);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x71,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_128)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_128[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar8._vptr_DeathTest = *(_func_int ***)local_128[0]._M_head_impl;
      _Var9._M_head_impl = local_128[0]._M_head_impl;
LAB_0014be9e:
      (*DVar8._vptr_DeathTest[1])(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)empty.size_);
    bVar4 = testing::internal::DeathTest::Create
                      ("empty.front()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_d8,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x72,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_d8);
    _Var9._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)gtest_sentinel;
    if (!bVar4) goto LAB_0014bf81;
    if (gtest_sentinel.test_ != (DeathTest *)0x0) {
      iVar6 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar1 = gtest_sentinel;
      if (iVar6 == 0) {
        iVar6 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        iVar6 = (*(RVar1.test_)->_vptr_DeathTest[4])(RVar1.test_,(ulong)bVar4);
        if ((char)iVar6 == '\0') {
          (*((DeathTest *)_Var9._M_head_impl)->_vptr_DeathTest[1])(_Var9._M_head_impl);
          goto LAB_0014bf81;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel_4 = gtest_sentinel;
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          Span<const_int>::front(&empty);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel_4);
      }
      DVar8 = (DeathTest)((DeathTest *)_Var9._M_head_impl)->_vptr_DeathTest;
      goto LAB_0014bfd0;
    }
  }
  else {
LAB_0014bf81:
    testing::Message::Message((Message *)local_128);
    pcVar7 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x72,pcVar7);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_128)
    ;
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
    if (local_128[0]._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      DVar8._vptr_DeathTest = *(_func_int ***)local_128[0]._M_head_impl;
      _Var9._M_head_impl = local_128[0]._M_head_impl;
LAB_0014bfd0:
      (*DVar8._vptr_DeathTest[1])(_Var9._M_head_impl);
    }
  }
  bVar4 = testing::internal::AlwaysTrue();
  if (bVar4) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_((char *)empty.size_);
    bVar4 = testing::internal::DeathTest::Create
                      ("empty.back()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_f0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x73,&gtest_sentinel.test_);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_f0);
    RVar1 = gtest_sentinel;
    if (bVar4) {
      if (gtest_sentinel.test_ == (DeathTest *)0x0) {
        return;
      }
      iVar6 = (*(gtest_sentinel.test_)->_vptr_DeathTest[2])(gtest_sentinel.test_);
      RVar2 = gtest_sentinel;
      if (iVar6 == 0) {
        iVar6 = (*(gtest_sentinel.test_)->_vptr_DeathTest[3])(gtest_sentinel.test_);
        bVar4 = testing::internal::ExitedUnsuccessfully(iVar6);
        iVar6 = (*(RVar2.test_)->_vptr_DeathTest[4])(RVar2.test_,(ulong)bVar4);
        if ((char)iVar6 == '\0') {
          (*(RVar1.test_)->_vptr_DeathTest[1])(RVar1.test_);
          goto LAB_0014c0b3;
        }
      }
      else if (iVar6 == 1) {
        gtest_sentinel_4 = gtest_sentinel;
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          Span<const_int>::back(&empty);
        }
        (*(gtest_sentinel.test_)->_vptr_DeathTest[5])(gtest_sentinel.test_,2);
        testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&gtest_sentinel_4);
      }
      DVar8 = (DeathTest)(RVar1.test_)->_vptr_DeathTest;
      local_128[0]._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)RVar1;
      goto LAB_0014c102;
    }
  }
LAB_0014c0b3:
  testing::Message::Message((Message *)local_128);
  pcVar7 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&gtest_sentinel,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
             ,0x73,pcVar7);
  testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_sentinel,(Message *)local_128);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_sentinel);
  if (local_128[0]._M_head_impl ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    return;
  }
  DVar8._vptr_DeathTest = *(_func_int ***)local_128[0]._M_head_impl;
LAB_0014c102:
  (*DVar8._vptr_DeathTest[1])(local_128[0]._M_head_impl);
  return;
}

Assistant:

TEST(SpanDeathTest, BoundsChecks) {
  // Make an array that's larger than we need, so that a failure to bounds check
  // won't crash.
  const int v[] = {1, 2, 3, 4};
  Span<const int> span(v, 3);
  // Out of bounds access.
  EXPECT_DEATH_IF_SUPPORTED(span[3], "");
  EXPECT_DEATH_IF_SUPPORTED(span.subspan(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.first(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.last(4), "");
  // Accessing an empty span.
  Span<const int> empty(v, 0);
  EXPECT_DEATH_IF_SUPPORTED(empty[0], "");
  EXPECT_DEATH_IF_SUPPORTED(empty.front(), "");
  EXPECT_DEATH_IF_SUPPORTED(empty.back(), "");
}